

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.hpp
# Opt level: O3

void czh::utils::digit_gen(DiyFp W,DiyFp Mp,DiyFp delta,string *buffer,int *K)

{
  byte bVar1;
  ulong rest;
  ulong uVar2;
  ulong delta_00;
  ulong uVar3;
  long lVar4;
  uint64_t wp_w;
  uint uVar5;
  uint64_t ten_kappa;
  int iVar6;
  ulong uVar7;
  DiyFp DVar8;
  DiyFp local_50;
  DiyFp local_40;
  
  delta_00 = delta.f;
  local_50.f = Mp.f;
  local_40.f = W.f;
  local_50.e = Mp.e;
  local_40.e = W.e;
  bVar1 = -(char)Mp.e;
  ten_kappa = 1L << (bVar1 & 0x3f);
  DVar8 = DiyFp::operator-(&local_50,&local_40);
  wp_w = DVar8.f;
  uVar3 = local_50.f >> (bVar1 & 0x3f);
  uVar2 = local_50.f & ten_kappa - 1;
  uVar7 = 1000000000;
  uVar5 = 0xb;
  while( true ) {
    if (((uint)uVar7 <= (uint)uVar3) || (buffer->_M_string_length != 0)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (buffer,(char)((uVar3 & 0xffffffff) / uVar7) + '0');
    }
    uVar3 = (uVar3 & 0xffffffff) % uVar7;
    rest = (uVar3 << (bVar1 & 0x3f)) + uVar2;
    if (rest <= delta_00) break;
    uVar7 = uVar7 / 10;
    uVar5 = uVar5 - 1;
    if (uVar5 < 2) {
      lVar4 = 1;
      iVar6 = 0;
      rest = uVar2;
      do {
        uVar3 = rest * 10 >> (bVar1 & 0x3f);
        if ((uVar3 & 0xffffffff) != 0 || buffer->_M_string_length != 0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (buffer,(char)uVar3 + '0');
        }
        delta_00 = delta_00 * 10;
        lVar4 = lVar4 * 10;
        rest = rest * 10 & ten_kappa - 1;
        iVar6 = iVar6 + -1;
      } while (delta_00 <= rest);
      *K = *K + iVar6;
      wp_w = lVar4 * wp_w;
LAB_0010f75c:
      grisu_round(buffer,delta_00,rest,ten_kappa,wp_w);
      return;
    }
  }
  *K = *K + uVar5 + -2;
  ten_kappa = uVar7 << (bVar1 & 0x3f);
  goto LAB_0010f75c;
}

Assistant:

void digit_gen(DiyFp W, DiyFp Mp, DiyFp delta, std::string &buffer, int &K)
  {
    uint32_t div;
    int d, kappa;
    DiyFp one{((uint64_t) 1) << -Mp.e, Mp.e};
    DiyFp wp_w = Mp - W;
    uint32_t p1 = Mp.f >> -one.e;
    uint64_t p2 = Mp.f & (one.f - 1);
    kappa = 10;
    div = TEN9;
    while (kappa > 0)
    {
      d = static_cast<int>(p1 / div);
      if (d || !buffer.empty())
        buffer += static_cast<char>(static_cast<int>('0') + d);
      p1 %= div;
      kappa--;
      uint64_t tmp = (((uint64_t) p1) << -one.e) + p2;
      if (tmp <= delta.f)
      {
        K += kappa;
        grisu_round(buffer, delta.f, tmp, ((uint64_t) div) << -one.e, wp_w.f);
        return;
      }
      div /= 10;
    }
    uint64_t unit = 1;
    while (true)
    {
      p2 *= 10;
      delta.f *= 10;
      unit *= 10;
      d = static_cast<int>(p2 >> -one.e);
      if (d || !buffer.empty())
        buffer += static_cast<char>(static_cast<int>('0') + d);
      p2 &= one.f - 1;
      kappa--;
      if (p2 < delta.f)
      {
        K += kappa;
        grisu_round(buffer, delta.f, p2, one.f, wp_w.f * unit);
        return;
      }
    }
  }